

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O0

void __thiscall
num_parse_test_parse_float_Test::num_parse_test_parse_float_Test
          (num_parse_test_parse_float_Test *this)

{
  num_parse_test_parse_float_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__num_parse_test_parse_float_Test_00200920;
  return;
}

Assistant:

TEST(num_parse_test, parse_float) {
  uint32_t f_as_ui = 0x3fc00000; // 1.5
  auto resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, 1.5);

  f_as_ui = 0x3f900000; // 1.125
  resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, 1.125);

  f_as_ui = 0xc0100000; // -2.25
  resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, -2.25);
}